

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircleWidget.cpp
# Opt level: O0

void __thiscall CircleWidget::paintEvent(CircleWidget *this,QPaintEvent *event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QRect local_54;
  QRect local_44;
  QPainter local_28 [8];
  QPainter painter;
  int offset;
  int margin;
  QPaintEvent *event_local;
  CircleWidget *this_local;
  
  iVar1 = QWidget::width(&this->super_QWidget);
  iVar2 = QPen::width();
  iVar2 = iVar2 / 2 + iVar1 / 6;
  _painter = iVar2;
  iVar3 = QWidget::width(&this->super_QWidget);
  if (iVar3 / 2 <= iVar2) {
    _painter = _painter - iVar1 / 6;
  }
  QPainter::QPainter(local_28,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_28,true);
  QPainter::setPen((QPen *)local_28);
  QPainter::setBrush((QBrush *)local_28);
  local_54 = QWidget::rect(&this->super_QWidget);
  local_44 = QRect::adjusted(&local_54,_painter,_painter,-_painter,-_painter);
  QPainter::drawEllipse((QRect *)local_28);
  QPainter::~QPainter(local_28);
  return;
}

Assistant:

void CircleWidget::paintEvent(QPaintEvent *event) {
    int margin = width() / 6;

    // pen.width() / 2 because when painting a shape with an outline, we have to factor in the width of the pen
    int offset = pen.width() / 2 + margin;

    if (offset >= width() / 2)
        offset -= margin;

    QPainter painter(this);
    painter.setRenderHint(QPainter::Antialiasing);
    painter.setPen(pen);
    painter.setBrush(brush);
    painter.drawEllipse(rect().adjusted(offset, offset, -offset, -offset));
}